

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

appender fmt::v10::detail::copy_str<char,char*,fmt::v10::appender>
                   (char *begin,char *end,appender out)

{
  back_insert_iterator<fmt::v10::detail::buffer<char>_> *this;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_38;
  char local_29;
  char *local_28;
  char *end_local;
  char *begin_local;
  appender out_local;
  
  local_28 = end;
  end_local = begin;
  begin_local = (char *)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  while (end_local != local_28) {
    local_29 = *end_local;
    end_local = end_local + 1;
    local_38.container = (buffer<char> *)appender::operator++((appender *)&begin_local,0);
    this = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(this,&local_29);
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)begin_local;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}